

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
wasm::debug::copyDebugInfo(wasm::Expression*,wasm::Expression*,wasm::Function*,wasm::Function*)::
Lister::visitExpression(wasm::Expression__(void *this,Expression *curr)

{
  iterator __position;
  Expression *local_10;
  Expression *curr_local;
  
  __position._M_current = *(Expression ***)((long)this + 0xe0);
  if (__position._M_current == *(Expression ***)((long)this + 0xe8)) {
    local_10 = curr;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    _M_realloc_insert<wasm::Expression*const&>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)((long)this + 0xd8),
               __position,&local_10);
  }
  else {
    *__position._M_current = curr;
    *(long *)((long)this + 0xe0) = *(long *)((long)this + 0xe0) + 8;
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) { list.push_back(curr); }